

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O1

UDate uprv_getRawUTCtime_63(void)

{
  timeval posixTime;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  return (double)(local_18.tv_usec / 1000 + local_18.tv_sec * 1000);
}

Assistant:

U_CAPI UDate U_EXPORT2
uprv_getRawUTCtime()
{
#if U_PLATFORM_USES_ONLY_WIN32_API

    FileTimeConversion winTime;
    GetSystemTimeAsFileTime(&winTime.fileTime);
    return (UDate)((winTime.int64 - EPOCH_BIAS) / HECTONANOSECOND_PER_MILLISECOND);
#else

#if HAVE_GETTIMEOFDAY
    struct timeval posixTime;
    gettimeofday(&posixTime, NULL);
    return (UDate)(((int64_t)posixTime.tv_sec * U_MILLIS_PER_SECOND) + (posixTime.tv_usec/1000));
#else
    time_t epochtime;
    time(&epochtime);
    return (UDate)epochtime * U_MILLIS_PER_SECOND;
#endif

#endif
}